

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::ES> *this
          ,TestShaderType tested_shader_type)

{
  TestError *this_00;
  ulong uVar1;
  string *cs;
  allocator<char> local_2b0;
  allocator<char> local_2af;
  allocator<char> local_2ae;
  allocator<char> local_2ad;
  allocator<char> local_2ac;
  allocator<char> local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  allocator<char> local_2a8;
  allocator<char> local_2a7;
  allocator<char> local_2a6;
  allocator<char> local_2a5;
  TestShaderType local_2a4;
  string shader_source;
  string shader_variable_declarations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string input [15];
  
  local_2a4 = tested_shader_type;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shader_variable_declarations,
             "= float[2][1][2][1](\n        float[1][2][1](\n            float[2][1]( \n                float[1](12.3), float[1](54.2) \n            )\n        ),\n        float[1][2][1](\n            float[2][1]( \n                float[1]( 3.2), float[1]( 7.4) \n            )\n        )\n    );\n\n"
             ,(allocator<char> *)input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)input,"float a[2][1][2][]",(allocator<char> *)&shader_source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 1),"float a[2][1][][1]",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 2),"float a[2][1][][]",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 3),"float a[2][][2][1]",&local_2a5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 4),"float a[2][][2][]",&local_2a6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 5),"float a[2][][][1]",&local_2a7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 6),"float a[2][][][]",&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 7),"float a[][1][2][1]",&local_2a9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 8),"float a[][1][2][]",&local_2aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 9),"float a[][1][][1]",&local_2ab);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 10),"float a[][1][][]",&local_2ac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 0xb),"float a[][][2][1]",&local_2ad);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 0xc),"float a[][][2][]",&local_2ae);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 0xd),"float a[][][][1]",&local_2af);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(input + 0xe),"float a[][][][]",&local_2b0);
  uVar1 = (ulong)local_2a4;
  std::operator+(&local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,"    ");
  std::operator+(&local_238,&local_258,input);
  std::operator+(&shader_source,&local_238,&shader_variable_declarations);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  if (TESSELATION_EVALUATION_SHADER_TYPE < local_2a4) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x847);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((long)&switchD_00b7a6c4::switchdataD_01721fb0 +
         (long)(int)(&switchD_00b7a6c4::switchdataD_01721fb0)[uVar1]) {
  case 0xb7a6c6:
    std::__cxx11::string::append((char *)&shader_source);
    break;
  case 0xb7a6d9:
  case 0xb7a6e0:
    std::__cxx11::string::append((string *)&shader_source);
  }
  std::__cxx11::string::append((string *)&shader_source);
  (*(code *)(&DAT_01721fc8 + *(int *)(&DAT_01721fc8 + uVar1 * 4)))();
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_variable_declarations = "= float[2][1][2][1](\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1](12.3), float[1](54.2) \n"
											   "            )\n"
											   "        ),\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1]( 3.2), float[1]( 7.4) \n"
											   "            )\n"
											   "        )\n"
											   "    );\n\n";

	std::string input[] = { "float a[2][1][2][]", "float a[2][1][][1]", "float a[2][1][][]", "float a[2][][2][1]",
							"float a[2][][2][]",  "float a[2][][][1]",  "float a[2][][][]",  "float a[][1][2][1]",
							"float a[][1][2][]",  "float a[][1][][1]",  "float a[][1][][]",  "float a[][][2][1]",
							"float a[][][2][]",   "float a[][][][1]",   "float a[][][][]" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + "    " + input[string_index] + shader_variable_declarations;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}